

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O1

void __thiscall PrettyPrinter::visit(PrettyPrinter *this,LetStmt *node)

{
  Identifier *pIVar1;
  Expr *pEVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"let ",4);
  pIVar1 = (node->m_ident)._M_t.
           super___uniq_ptr_impl<AST::Identifier,_std::default_delete<AST::Identifier>_>._M_t.
           super__Tuple_impl<0UL,_AST::Identifier_*,_std::default_delete<AST::Identifier>_>.
           super__Head_base<0UL,_AST::Identifier_*,_false>._M_head_impl;
  (**(code **)((long)(pIVar1->super_Expr).super_Stmt + 0x10))(pIVar1,this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," be ",4);
  pEVar2 = (node->m_expr)._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
           super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl;
  (*(pEVar2->super_Stmt)._vptr_Stmt[2])(pEVar2,this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void PrettyPrinter::visit(AST::LetStmt *node) {
    std::cout << "let ";
    node->m_ident->accept(this);
    std::cout << " be ";
    node->m_expr->accept(this);
    std::cout << ";" << std::endl;
}